

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t set_fflags(archive_write_disk *a)

{
  mode_t mode_00;
  wchar_t wVar1;
  fixup_entry *pfVar2;
  mode_t mode;
  wchar_t critical_flags;
  wchar_t r;
  unsigned_long clear;
  unsigned_long set;
  fixup_entry *le;
  archive_write_disk *a_local;
  
  le = (fixup_entry *)a;
  mode_00 = archive_entry_mode(a->entry);
  if ((le[2].fflags_set & 0x40) != 0) {
    archive_entry_fflags((archive_entry *)le[2].ctime,&clear,(unsigned_long *)&critical_flags);
    if ((clear & 0x4030) == 0) {
      wVar1 = set_fflags_platform((archive_write_disk *)le,
                                  *(wchar_t *)((long)&le[2].mac_metadata_size + 4),
                                  (char *)le[2].atime_nanos,mode_00,clear,_critical_flags);
      if (wVar1 != L'\0') {
        return wVar1;
      }
    }
    else {
      pfVar2 = current_fixup((archive_write_disk *)le,(char *)le[2].atime_nanos);
      if (pfVar2 == (fixup_entry *)0x0) {
        return L'\xffffffe2';
      }
      pfVar2->fixup = pfVar2->fixup | 0x40;
      pfVar2->fflags_set = clear;
      if ((pfVar2->fixup & 0x34000000U) == 0) {
        pfVar2->mode = mode_00;
      }
    }
  }
  return L'\0';
}

Assistant:

static int
set_fflags(struct archive_write_disk *a)
{
	struct fixup_entry *le;
	unsigned long	set, clear;
	int		r;
	int		critical_flags;
	mode_t		mode = archive_entry_mode(a->entry);

	/*
	 * Make 'critical_flags' hold all file flags that can't be
	 * immediately restored.  For example, on BSD systems,
	 * SF_IMMUTABLE prevents hardlinks from being created, so
	 * should not be set until after any hardlinks are created.  To
	 * preserve some semblance of portability, this uses #ifdef
	 * extensively.  Ugly, but it works.
	 *
	 * Yes, Virginia, this does create a security race.  It's mitigated
	 * somewhat by the practice of creating dirs 0700 until the extract
	 * is done, but it would be nice if we could do more than that.
	 * People restoring critical file systems should be wary of
	 * other programs that might try to muck with files as they're
	 * being restored.
	 */
	/* Hopefully, the compiler will optimize this mess into a constant. */
	critical_flags = 0;
#ifdef SF_IMMUTABLE
	critical_flags |= SF_IMMUTABLE;
#endif
#ifdef UF_IMMUTABLE
	critical_flags |= UF_IMMUTABLE;
#endif
#ifdef SF_APPEND
	critical_flags |= SF_APPEND;
#endif
#ifdef UF_APPEND
	critical_flags |= UF_APPEND;
#endif
#if defined(FS_APPEND_FL)
	critical_flags |= FS_APPEND_FL;
#elif defined(EXT2_APPEND_FL)
	critical_flags |= EXT2_APPEND_FL;
#endif
#if defined(FS_IMMUTABLE_FL)
	critical_flags |= FS_IMMUTABLE_FL;
#elif defined(EXT2_IMMUTABLE_FL)
	critical_flags |= EXT2_IMMUTABLE_FL;
#endif
#ifdef FS_JOURNAL_DATA_FL
	critical_flags |= FS_JOURNAL_DATA_FL;
#endif

	if (a->todo & TODO_FFLAGS) {
		archive_entry_fflags(a->entry, &set, &clear);

		/*
		 * The first test encourages the compiler to eliminate
		 * all of this if it's not necessary.
		 */
		if ((critical_flags != 0)  &&  (set & critical_flags)) {
			le = current_fixup(a, a->name);
			if (le == NULL)
				return (ARCHIVE_FATAL);
			le->fixup |= TODO_FFLAGS;
			le->fflags_set = set;
			/* Store the mode if it's not already there. */
			if ((le->fixup & TODO_MODE) == 0)
				le->mode = mode;
		} else {
			r = set_fflags_platform(a, a->fd,
			    a->name, mode, set, clear);
			if (r != ARCHIVE_OK)
				return (r);
		}
	}
	return (ARCHIVE_OK);
}